

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdKelvinFdBeginPatchD::is_valid_val(MthdKelvinFdBeginPatchD *this)

{
  uint uVar1;
  uint uVar2;
  int unk6;
  int unk3;
  int unk0;
  MthdKelvinFdBeginPatchD *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3d) >> 0x3d);
    uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3d);
    if ((uVar1 == 4) || (uVar1 == 7)) {
      this_local._7_1_ = false;
    }
    else if ((uVar2 == 4) || (uVar2 == 7)) {
      this_local._7_1_ = false;
    }
    else if ((uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x36) >> 0x3c) == 0)
    {
      this_local._7_1_ = false;
    }
    else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x39 == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (chipset.card_type != 0x20)
			return true;
		int unk0 = extr(val, 0, 3);
		int unk3 = extr(val, 3, 3);
		int unk6 = extr(val, 6, 4);
		if (unk0 == 4 || unk0 == 7)
			return false;
		if (unk3 == 4 || unk3 == 7)
			return false;
		if (!unk6)
			return false;
		if (extr(val, 17, 7))
			return false;
		return true;
	}